

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

bool __thiscall
cmLocalGenerator::GetShouldUseOldFlags(cmLocalGenerator *this,bool shared,string *lang)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  PolicyStatus PVar3;
  string *psVar4;
  ostream *poVar5;
  PolicyID id;
  byte bVar6;
  undefined7 in_register_00000031;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string flagsVar;
  string originalFlags;
  ostringstream e;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  size_type local_178;
  pointer local_170;
  undefined8 local_168;
  undefined8 local_160;
  char *local_158;
  undefined8 local_150;
  ios_base local_120 [264];
  
  cmGlobalGenerator::GetSharedLibFlagsForLanguage(&local_1b0,this->GlobalGenerator,lang);
  if ((int)CONCAT71(in_register_00000031,shared) != 0) {
    local_190._0_8_ = (_func_int **)0x15;
    local_190._8_8_ = "CMAKE_SHARED_LIBRARY_";
    local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_170 = (lang->_M_dataplus)._M_p;
    local_178 = lang->_M_string_length;
    local_168 = 0;
    local_160 = 6;
    local_158 = "_FLAGS";
    local_150 = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_190;
    cmCatViews(&local_1d0,views);
    psVar4 = cmMakefile::GetSafeDefinition(this->Makefile,&local_1d0);
    __n = psVar4->_M_string_length;
    if (__n == local_1b0._M_string_length) {
      if (__n != 0) {
        iVar2 = bcmp((psVar4->_M_dataplus)._M_p,local_1b0._M_dataplus._M_p,__n);
        if (iVar2 != 0) goto LAB_001cbdc1;
      }
LAB_001cbf33:
      bVar6 = shared;
      bVar1 = true;
    }
    else {
LAB_001cbdc1:
      PVar3 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0018,false);
      if (PVar3 - NEW < 3) {
        bVar6 = 0;
      }
      else {
        bVar6 = 1;
        if (PVar3 != OLD) {
          shared = (bool)1;
          if (PVar3 != WARN) goto LAB_001cbf33;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Variable ",9);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_190,local_1d0._M_dataplus._M_p,
                              local_1d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,
                     " has been modified. CMake will ignore the POSITION_INDEPENDENT_CODE target property for shared libraries and will use the "
                     ,0x7a);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," variable instead.  This may cause errors if the original content of ",
                     0x45);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," was removed.\n",0xe);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x12,id);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_1f0,
                              &this->DirectoryBacktrace);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
          std::ios_base::~ios_base(local_120);
        }
      }
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) goto LAB_001cbf56;
  }
  bVar6 = 0;
LAB_001cbf56:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool cmLocalGenerator::GetShouldUseOldFlags(bool shared,
                                            const std::string& lang) const
{
  std::string originalFlags =
    this->GlobalGenerator->GetSharedLibFlagsForLanguage(lang);
  if (shared) {
    std::string flagsVar = cmStrCat("CMAKE_SHARED_LIBRARY_", lang, "_FLAGS");
    std::string const& flags = this->Makefile->GetSafeDefinition(flagsVar);

    if (flags != originalFlags) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0018)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          e << "Variable " << flagsVar
            << " has been modified. CMake "
               "will ignore the POSITION_INDEPENDENT_CODE target property "
               "for "
               "shared libraries and will use the "
            << flagsVar
            << " variable "
               "instead.  This may cause errors if the original content of "
            << flagsVar << " was removed.\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0018);

          this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          return true;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          return false;
      }
    }
  }
  return false;
}